

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O1

coda_mem_record *
attribute_record_new
          (coda_type_record *definition,coda_xml_product *product,char *el,char **attr,
          int update_definition)

{
  coda_type *pcVar1;
  hashtable *table;
  uint8_t *data;
  coda_type_record_field **ppcVar2;
  bool bVar3;
  int iVar4;
  coda_mem_record *type;
  char *pcVar5;
  long lVar6;
  coda_mem_data *pcVar7;
  long lVar8;
  char *name;
  size_t length;
  coda_type_text *pcVar9;
  uint uVar10;
  char *real_name;
  char *real_name_1;
  char *local_38;
  
  if (definition->is_union != 0) {
    __assert_fail("!definition->is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x62,
                  "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                 );
  }
  type = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
  pcVar5 = coda_element_name_from_xml_name(el);
  if (pcVar5 != el) {
    lVar6 = coda_hashtable_get_index_from_name(definition->real_name_hash_data,"xmlns");
    uVar10 = (uint)lVar6;
    if (update_definition == 0) {
      if ((int)uVar10 < 0) goto LAB_001680c3;
      pcVar1 = definition->field[uVar10 & 0x7fffffff]->type;
      pcVar5 = coda_element_name_from_xml_name(el);
      pcVar7 = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                 (long)(pcVar5 + ~(ulong)el),(uint8_t *)el);
      if (pcVar7 == (coda_mem_data *)0x0) goto LAB_0016834c;
      iVar4 = coda_mem_record_add_field(type,"xmlns",(coda_dynamic_type *)pcVar7,0);
    }
    else {
      if ((int)uVar10 < 0) {
        pcVar9 = coda_type_text_new(coda_format_xml);
        if (pcVar9 == (coda_type_text *)0x0) {
          coda_dynamic_type_delete((coda_dynamic_type *)type);
          return (coda_mem_record *)0x0;
        }
        pcVar5 = coda_element_name_from_xml_name(el);
        pcVar7 = coda_mem_data_new((coda_type *)pcVar9,(coda_dynamic_type *)0x0,
                                   (coda_product *)product,(long)(pcVar5 + ~(ulong)el),(uint8_t *)el
                                  );
        coda_type_release((coda_type *)pcVar9);
        iVar4 = update_definition;
      }
      else {
        if (type->field_type[uVar10 & 0x7fffffff] != (coda_dynamic_type *)0x0) {
          __assert_fail("attributes->field_type[attribute_index] == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                        ,0x7c,
                        "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                       );
        }
        pcVar1 = definition->field[uVar10 & 0x7fffffff]->type;
        pcVar5 = coda_element_name_from_xml_name(el);
        pcVar7 = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                   (long)(pcVar5 + ~(ulong)el),(uint8_t *)el);
        iVar4 = 0;
      }
      if (pcVar7 == (coda_mem_data *)0x0) goto LAB_0016834c;
      iVar4 = coda_mem_record_add_field(type,"xmlns",(coda_dynamic_type *)pcVar7,iVar4);
    }
    if (iVar4 != 0) {
      coda_dynamic_type_delete((coda_dynamic_type *)pcVar7);
LAB_0016834c:
      coda_dynamic_type_delete((coda_dynamic_type *)type);
      return (coda_mem_record *)0x0;
    }
  }
LAB_001680c3:
  pcVar5 = *attr;
  if (pcVar5 != (char *)0x0) {
    lVar6 = 2;
    do {
      lVar8 = coda_hashtable_get_index_from_name(definition->real_name_hash_data,pcVar5);
      uVar10 = (uint)lVar8;
      if ((int)uVar10 < 0) {
        table = definition->real_name_hash_data;
        name = coda_element_name_from_xml_name(pcVar5);
        lVar8 = coda_hashtable_get_index_from_name(table,name);
        uVar10 = (uint)lVar8;
        if (-1 < (int)uVar10) {
          pcVar5 = coda_element_name_from_xml_name(pcVar5);
        }
      }
      iVar4 = (int)lVar6;
      if (update_definition == 0) {
        if (uVar10 == 0xffffffff) {
          coda_set_error(-300,"xml attribute \'%s\' is not allowed",attr[lVar6 + -2]);
        }
        else {
          pcVar1 = definition->field[(int)uVar10]->type;
          data = (uint8_t *)attr[iVar4 - 1];
          length = strlen((char *)data);
          pcVar7 = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,length,
                                     data);
LAB_001681be:
          iVar4 = 0;
LAB_0016822c:
          if (pcVar7 != (coda_mem_data *)0x0) {
            iVar4 = coda_mem_record_add_field(type,pcVar5,(coda_dynamic_type *)pcVar7,iVar4);
            if (iVar4 == 0) {
              bVar3 = false;
              goto LAB_00168272;
            }
            coda_dynamic_type_delete((coda_dynamic_type *)pcVar7);
          }
        }
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        bVar3 = true;
      }
      else if ((int)uVar10 < 0) {
        pcVar9 = coda_type_text_new(coda_format_xml);
        if (pcVar9 != (coda_type_text *)0x0) {
          pcVar7 = coda_mem_string_new(pcVar9,(coda_dynamic_type *)0x0,(coda_product *)product,
                                       attr[iVar4 - 1]);
          coda_type_release((coda_type *)pcVar9);
          iVar4 = update_definition;
          goto LAB_0016822c;
        }
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        bVar3 = true;
      }
      else {
        bVar3 = false;
        if (type->field_type[uVar10] == (coda_dynamic_type *)0x0) {
          pcVar7 = coda_mem_string_new((coda_type_text *)definition->field[uVar10]->type,
                                       (coda_dynamic_type *)0x0,(coda_product *)product,
                                       attr[iVar4 - 1]);
          goto LAB_001681be;
        }
      }
LAB_00168272:
      if (bVar3) {
        return (coda_mem_record *)0x0;
      }
      pcVar5 = attr[lVar6];
      lVar6 = lVar6 + 2;
    } while (pcVar5 != (char *)0x0);
  }
  lVar6 = definition->num_fields;
  if (lVar6 < 1) {
    return type;
  }
  ppcVar2 = definition->field;
  lVar8 = 0;
  do {
    if ((ppcVar2[lVar8]->optional == '\0') && (type->field_type[lVar8] == (coda_dynamic_type *)0x0))
    {
      if (update_definition == 0) {
        coda_type_get_record_field_real_name((coda_type *)definition,lVar8,&local_38);
        coda_set_error(-300,"mandatory xml attribute \'%s\' is missing",local_38);
        goto LAB_0016834c;
      }
      ppcVar2[lVar8]->optional = '\x01';
    }
    lVar8 = lVar8 + 1;
    if (lVar6 == lVar8) {
      return type;
    }
  } while( true );
}

Assistant:

static coda_mem_record *attribute_record_new(coda_type_record *definition, coda_xml_product *product, const char *el,
                                             const char **attr, int update_definition)
{
    coda_mem_record *attributes;
    coda_mem_data *attribute;
    int update_mem_record = update_definition;
    int attribute_index;
    int i;

    assert(definition != NULL);
    assert(!definition->is_union);
    attributes = coda_mem_record_new(definition, NULL);

    if (el != coda_element_name_from_xml_name(el))
    {
        /* store the namespace part of the full xml name as an 'xmlns' attribute */
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, "xmlns");
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_data_new((coda_type *)attribute_definition, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                coda_type_release((coda_type *)attribute_definition);
            }
            else
            {
                assert(attributes->field_type[attribute_index] == NULL);
                attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                update_mem_record = 0;
            }
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
        else if (attribute_index >= 0)
        {
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)(coda_element_name_from_xml_name(el) - el - 1), (const uint8_t *)el);
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    /* add attributes to attribute list */
    for (i = 0; attr[2 * i] != NULL; i++)
    {
        const char *real_name = attr[2 * i];

        update_mem_record = update_definition;
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, real_name);
        if (attribute_index < 0)
        {
            attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data,
                                                            coda_element_name_from_xml_name(real_name));
            if (attribute_index >= 0)
            {
                real_name = coda_element_name_from_xml_name(real_name);
            }
        }
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_string_new(attribute_definition, NULL, (coda_product *)product, attr[2 * i + 1]);
                coda_type_release((coda_type *)attribute_definition);
            }
            else if (attributes->field_type[attribute_index] != NULL)
            {
                /* we only add the first occurrence when there are multiple attributes with the same attribute name */
                continue;
            }
            else
            {
                attribute = coda_mem_string_new((coda_type_text *)definition->field[attribute_index]->type, NULL,
                                                (coda_product *)product, attr[2 * i + 1]);
                update_mem_record = 0;
            }
        }
        else
        {
            if (attribute_index == -1)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml attribute '%s' is not allowed", attr[2 * i]);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)strlen(attr[2 * i + 1]), (uint8_t *)attr[2 * i + 1]);
        }
        if (attribute == NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }

        if (coda_mem_record_add_field(attributes, real_name, (coda_dynamic_type *)attribute, update_mem_record) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attribute);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }
    }

    for (i = 0; i < definition->num_fields; i++)
    {
        if (!definition->field[i]->optional && attributes->field_type[i] == NULL)
        {
            if (update_definition)
            {
                definition->field[i]->optional = 1;
            }
            else
            {
                const char *real_name;

                coda_type_get_record_field_real_name((coda_type *)definition, i, &real_name);
                coda_set_error(CODA_ERROR_PRODUCT, "mandatory xml attribute '%s' is missing", real_name);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    return attributes;
}